

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.c
# Opt level: O2

void cstr_fill_bytes(char **cstring,char byte,size_t len)

{
  long lVar1;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cstr_resize(cstring,len);
  memset(*cstring,(int)CONCAT71(in_register_00000031,byte),len);
  *(size_t *)(*cstring + -0x10) = len;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void
cstr_fill_bytes(char** cstring, char byte, size_t len)
{
  struct STRING_HEADER* header;

  /* resize the string with the given length */
  cstr_resize(cstring, len);
  /* initialize the memory of the cstring with byte */
  memset((void*)*cstring, (int)byte, len);
  /* dereference here since the memory address might have changed in cstr_resize */
  header = GET_HEADER(*cstring);
  /* set the length of the string to the newly allocated length */
  header->strlen = len;
}